

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O3

void __thiscall
Assimp::IFC::Schema_2x3::IfcStructuralPointAction::~IfcStructuralPointAction
          (IfcStructuralPointAction *this)

{
  void *pvVar1;
  long lVar2;
  
  lVar2 = *(long *)(*(long *)&(this->super_IfcStructuralAction).super_IfcStructuralActivity.
                              super_IfcProduct.super_IfcObject + -0x18);
  pvVar1 = &(this->super_IfcStructuralAction).field_0x158 + lVar2;
  *(undefined8 *)((long)pvVar1 + -0x158) = 0x931338;
  *(undefined8 *)((long)pvVar1 + 0x30) = 0x931428;
  *(undefined8 *)((long)pvVar1 + -0xd0) = 0x931360;
  *(undefined8 *)((long)pvVar1 + -0xc0) = 0x931388;
  *(undefined8 *)((long)pvVar1 + -0x88) = 0x9313b0;
  *(undefined8 *)((long)pvVar1 + -0x58) = 0x9313d8;
  *(undefined8 *)((long)pvVar1 + -0x20) = 0x931400;
  if (*(void **)((long)pvVar1 + -0x10) != pvVar1) {
    operator_delete(*(void **)((long)pvVar1 + -0x10));
  }
  IfcStructuralActivity::~IfcStructuralActivity
            ((IfcStructuralActivity *)
             (&(this->super_IfcStructuralAction).super_IfcStructuralActivity.super_IfcProduct.
               super_IfcObject.field_0x0 + lVar2),&PTR_construction_vtable_24__009311a8);
  return;
}

Assistant:

IfcStructuralPointAction() : Object("IfcStructuralPointAction") {}